

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaAreValuesEqual(xmlSchemaValPtr x,xmlSchemaValPtr y)

{
  xmlSchemaValType xVar1;
  int iVar2;
  xmlSchemaTypePtr pxVar3;
  xmlSchemaTypePtr pxVar4;
  xmlChar *str1;
  xmlChar *str2;
  
LAB_001a2718:
  if (x == (xmlSchemaValPtr)0x0) {
    return 0;
  }
  xVar1 = xmlSchemaGetValType(x);
  pxVar3 = xmlSchemaGetBuiltInType(xVar1);
  xVar1 = xmlSchemaGetValType(y);
  pxVar4 = xmlSchemaGetBuiltInType(xVar1);
  for (; pxVar3 != (xmlSchemaTypePtr)0x0; pxVar3 = pxVar3->baseType) {
    if ((pxVar3->builtInType == 0x2e) || ((pxVar3->flags & 0x4000) != 0)) goto LAB_001a2764;
  }
  pxVar3 = (xmlSchemaTypePtr)0x0;
LAB_001a2764:
  do {
    if (pxVar4 == (xmlSchemaTypePtr)0x0) break;
    if ((pxVar4->builtInType == 0x2e) || ((pxVar4->flags & 0x4000) != 0)) goto LAB_001a2780;
    pxVar4 = pxVar4->baseType;
  } while( true );
  pxVar4 = (xmlSchemaTypePtr)0x0;
LAB_001a2780:
  if (pxVar3 != pxVar4) {
    return 0;
  }
  if ((pxVar3->builtInType == 1) ||
     ((pxVar3->builtInType == 0x2e && (pxVar3->type == XML_SCHEMA_TYPE_BASIC)))) {
    str1 = xmlSchemaValueGetAsString(x);
    str2 = xmlSchemaValueGetAsString(y);
    iVar2 = xmlStrEqual(str1,str2);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    iVar2 = xmlSchemaCompareValuesWhtsp
                      (x,XML_SCHEMA_WHITESPACE_PRESERVE,y,XML_SCHEMA_WHITESPACE_PRESERVE);
    if (iVar2 != 0) {
      if (iVar2 != -2) {
        return 0;
      }
      return -1;
    }
  }
  x = xmlSchemaValueGetNext(x);
  y = xmlSchemaValueGetNext(y);
  if (x == (xmlSchemaValPtr)0x0) {
    return (uint)(y == (xmlSchemaValPtr)0x0);
  }
  if (y == (xmlSchemaValPtr)0x0) {
    return 0;
  }
  goto LAB_001a2718;
}

Assistant:

static int
xmlSchemaAreValuesEqual(xmlSchemaValPtr x,
		       xmlSchemaValPtr y)
{
    xmlSchemaTypePtr tx, ty, ptx, pty;
    int ret;

    while (x != NULL) {
	/* Same types. */
	tx = xmlSchemaGetBuiltInType(xmlSchemaGetValType(x));
	ty = xmlSchemaGetBuiltInType(xmlSchemaGetValType(y));
	ptx = xmlSchemaGetPrimitiveType(tx);
	pty = xmlSchemaGetPrimitiveType(ty);
	/*
	* (1) if a datatype T' is `derived` by `restriction` from an
	* atomic datatype T then the `value space` of T' is a subset of
	* the `value space` of T. */
	/*
	* (2) if datatypes T' and T'' are `derived` by `restriction`
	* from a common atomic ancestor T then the `value space`s of T'
	* and T'' may overlap.
	*/
	if (ptx != pty)
	    return(0);
	/*
	* We assume computed values to be normalized, so do a fast
	* string comparison for string based types.
	*/
	if ((ptx->builtInType == XML_SCHEMAS_STRING) ||
	    WXS_IS_ANY_SIMPLE_TYPE(ptx)) {
	    if (! xmlStrEqual(
		xmlSchemaValueGetAsString(x),
		xmlSchemaValueGetAsString(y)))
		return (0);
	} else {
	    ret = xmlSchemaCompareValuesWhtsp(
		x, XML_SCHEMA_WHITESPACE_PRESERVE,
		y, XML_SCHEMA_WHITESPACE_PRESERVE);
	    if (ret == -2)
		return(-1);
	    if (ret != 0)
		return(0);
	}
	/*
	* Lists.
	*/
	x = xmlSchemaValueGetNext(x);
	if (x != NULL) {
	    y = xmlSchemaValueGetNext(y);
	    if (y == NULL)
		return (0);
	} else if (xmlSchemaValueGetNext(y) != NULL)
	    return (0);
	else
	    return (1);
    }
    return (0);
}